

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

void __thiscall NodeFS::NodeFS(NodeFS *this)

{
  this->_vptr_NodeFS = (_func_int **)&PTR__NodeFS_001ce4b0;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sub_node_).super__Vector_base<NodeFS_*,_std::allocator<NodeFS_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->offset_ = 0;
  this->buffer_ = (uchar *)0x0;
  this->type_ = -1;
  return;
}

Assistant:

NodeFS::NodeFS() : buffer_(nullptr), offset_(0), type_(-1)
{
}